

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::Partition::Dump(Partition *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char acStack_a8 [136];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  KLVPacket::Dump((KLVPacket *)this,stream,this->m_Dict,false);
  fprintf((FILE *)stream,"  MajorVersion       = %hu\n",(ulong)this->MajorVersion);
  fprintf((FILE *)stream,"  MinorVersion       = %hu\n",(ulong)this->MinorVersion);
  fprintf((FILE *)stream,"  KAGSize            = %u\n",(ulong)this->KAGSize);
  snprintf(acStack_a8,0x40,"%llu",this->ThisPartition);
  fprintf((FILE *)stream,"  ThisPartition      = %s\n",acStack_a8);
  snprintf(acStack_a8,0x40,"%llu",this->PreviousPartition);
  fprintf((FILE *)stream,"  PreviousPartition  = %s\n",acStack_a8);
  snprintf(acStack_a8,0x40,"%llu",this->FooterPartition);
  fprintf((FILE *)stream,"  FooterPartition    = %s\n",acStack_a8);
  snprintf(acStack_a8,0x40,"%llu",this->HeaderByteCount);
  fprintf((FILE *)stream,"  HeaderByteCount    = %s\n",acStack_a8);
  snprintf(acStack_a8,0x40,"%llu",this->IndexByteCount);
  fprintf((FILE *)stream,"  IndexByteCount     = %s\n",acStack_a8);
  fprintf((FILE *)stream,"  IndexSID           = %u\n",(ulong)this->IndexSID);
  snprintf(acStack_a8,0x40,"%llu",this->BodyOffset);
  fprintf((FILE *)stream,"  BodyOffset         = %s\n",acStack_a8);
  fprintf((FILE *)stream,"  BodySID            = %u\n",(ulong)this->BodySID);
  pcVar1 = UL::EncodeString(&this->OperationalPattern,acStack_a8,0x80);
  fprintf((FILE *)stream,"  OperationalPattern = %s\n",pcVar1);
  fputs("Essence Containers:\n",(FILE *)stream);
  FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>::Dump
            (&(this->EssenceContainers).
              super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>,stream,0);
  return;
}

Assistant:

void
ASDCP::MXF::Partition::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];

  if ( stream == 0 )
    stream = stderr;

  KLVFilePacket::Dump(stream, *m_Dict, false);
  fprintf(stream, "  MajorVersion       = %hu\n", MajorVersion);
  fprintf(stream, "  MinorVersion       = %hu\n", MinorVersion);
  fprintf(stream, "  KAGSize            = %u\n",  KAGSize);
  fprintf(stream, "  ThisPartition      = %s\n",  ui64sz(ThisPartition, identbuf));
  fprintf(stream, "  PreviousPartition  = %s\n",  ui64sz(PreviousPartition, identbuf));
  fprintf(stream, "  FooterPartition    = %s\n",  ui64sz(FooterPartition, identbuf));
  fprintf(stream, "  HeaderByteCount    = %s\n",  ui64sz(HeaderByteCount, identbuf));
  fprintf(stream, "  IndexByteCount     = %s\n",  ui64sz(IndexByteCount, identbuf));
  fprintf(stream, "  IndexSID           = %u\n",  IndexSID);
  fprintf(stream, "  BodyOffset         = %s\n",  ui64sz(BodyOffset, identbuf));
  fprintf(stream, "  BodySID            = %u\n",  BodySID);
  fprintf(stream, "  OperationalPattern = %s\n",  OperationalPattern.EncodeString(identbuf, IdentBufferLen));
  fputs("Essence Containers:\n", stream); EssenceContainers.Dump(stream);
}